

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O3

obj_use_status object_selection_checks(obj *otmp,char *word)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  boolean bVar4;
  boolean bVar5;
  int iVar6;
  uint uVar7;
  bool bVar8;
  long dummymask;
  long lStack_38;
  
  uVar3 = otmp->otyp;
  bVar4 = taking_off(word);
  if ((bVar4 != '\0') && ((otmp->owornmask & 0xf007fU) == 0)) {
    return ALREADY_IN_USE;
  }
  bVar5 = putting_on(word);
  if ((bVar5 != '\0') && ((otmp->owornmask & 0xf007fU) != 0)) {
    return ALREADY_IN_USE;
  }
  iVar6 = strcmp(word,"ready");
  if (iVar6 == 0) {
    if (uwep == otmp) {
      return ALREADY_IN_USE;
    }
    if ((uswapwep == otmp) && (u.twoweap != '\0')) {
      return ALREADY_IN_USE;
    }
  }
  if (bVar4 != '\0') {
    if (uarm == otmp && uarmc != (obj *)0x0) {
      return ARMOR_TAKEOFF_BLOCKED;
    }
    if ((uarmu == otmp) && (uarm != (obj *)0x0 || uarmc != (obj *)0x0)) {
      return ARMOR_TAKEOFF_BLOCKED;
    }
  }
  uVar7 = (uint)(short)uVar3;
  if (bVar5 != '\0') {
    if (otmp->oclass == '\a') {
      if (uVar7 != 0x113) {
        return UNSUITABLE_USE;
      }
    }
    else if ((otmp->oclass == '\x06') && ((ushort)(uVar3 - 0xf0) < 0xfffd)) {
      return UNSUITABLE_USE;
    }
  }
  iVar6 = strcmp(word,"wield");
  if (((iVar6 == 0) && (otmp->oclass == '\x06')) && (objects[(short)uVar3].oc_subtyp == '\0')) {
    return UNSUITABLE_USE;
  }
  iVar6 = strcmp(word,"eat");
  if ((iVar6 == 0) && (bVar4 = is_edible(otmp), bVar4 == '\0')) {
    return UNSUITABLE_USE;
  }
  iVar6 = strcmp(word,"sacrifice");
  if (iVar6 == 0) {
    if (0x36 < uVar3 - 0xd8) {
      return UNSUITABLE_USE;
    }
    if ((0x40000000000003U >> ((ulong)(uVar3 - 0xd8) & 0x3f) & 1) == 0) {
      return UNSUITABLE_USE;
    }
  }
  iVar6 = strcmp(word,"write with");
  if (((iVar6 == 0) && (otmp->oclass == '\x06')) && ((uVar7 != 0xf7 && (uVar3 != 0xef)))) {
    return UNSUITABLE_USE;
  }
  iVar6 = strcmp(word,"tin");
  if (iVar6 == 0) {
    if (uVar7 != 0x10e) {
      return UNSUITABLE_USE;
    }
    bVar4 = tinnable(otmp);
    if (bVar4 == '\0') {
      return UNSUITABLE_USE;
    }
  }
  iVar6 = strcmp(word,"rub");
  if (iVar6 == 0) {
    if ((otmp->oclass == '\x06') && ((ushort)(uVar3 - 0xea) < 0xfffd)) {
      return UNSUITABLE_USE;
    }
    if ((otmp->oclass == '\r') && (3 < (ushort)(otmp->otyp - 0x20fU))) {
      return UNSUITABLE_USE;
    }
  }
  iVar6 = strncmp(word,"rub on the stone",0x10);
  if ((((iVar6 == 0) && (otmp->oclass == '\r')) && ((otmp->field_0x4a & 0x20) != 0)) &&
     ((objects[(short)uVar3].field_0x10 & 1) != 0)) {
    return UNSUITABLE_USE;
  }
  iVar6 = strcmp(word,"tip");
  if ((iVar6 == 0) && (7 < (ushort)(otmp->otyp - 0xdaU))) {
    return UNSUITABLE_USE;
  }
  iVar6 = strcmp(word,"use or apply");
  if ((iVar6 == 0) || (iVar6 = strcmp(word,"untrap with"), iVar6 == 0)) {
    switch(otmp->oclass) {
    case '\x02':
      bVar2 = objects[otmp->otyp].oc_subtyp;
      if (((0x11 < bVar2) || ((0x20018U >> (bVar2 & 0x1f) & 1) == 0)) &&
         (bVar2 != 0x15 && uVar3 != 0x41)) {
        return UNSUITABLE_USE;
      }
      break;
    case '\a':
      if ((uVar7 != 0x115) && (uVar3 != 0x120)) {
        return UNSUITABLE_USE;
      }
      break;
    case '\b':
      if (uVar7 != 0x142) {
        return UNSUITABLE_USE;
      }
      if ((otmp->field_0x4a & 0x20) == 0) {
        return UNSUITABLE_USE;
      }
      if ((objects[0x142].field_0x10 & 1) == 0) {
        return UNSUITABLE_USE;
      }
      break;
    case '\f':
      return UNSUITABLE_USE;
    case '\r':
      if (3 < (ushort)(otmp->otyp - 0x20fU)) {
        return UNSUITABLE_USE;
      }
    }
  }
  iVar6 = strncmp(word,"invoke",6);
  if (((iVar6 == 0) && (otmp->oartifact == '\0')) &&
     (((objects[(short)uVar3].field_0x10 & 0x40) == 0 && uVar3 != 0xd8 &&
      (cVar1 = otmp->oclass, cVar1 != '\v')))) {
    if ((cVar1 == '\x06') && ((ushort)(uVar3 - 0xea) < 0xfffd)) {
      if (uVar7 == 0xec) goto LAB_001b0a80;
    }
    else {
      if (cVar1 == '\r') {
        bVar8 = (ushort)(otmp->otyp - 0x20fU) < 4;
      }
      else {
        bVar8 = cVar1 == '\x06';
      }
      if ((bool)(uVar3 == 0xec | bVar8)) goto LAB_001b0a80;
    }
    if ((uVar7 & 0xfffd) != 0xe9) {
      if (uVar7 != 0xe8) {
        return UNSUITABLE_USE;
      }
      if (((otmp->field_0x4a & 0x20) != 0) && ((objects[0xe8].field_0x10 & 1) != 0)) {
        return UNSUITABLE_USE;
      }
    }
  }
LAB_001b0a80:
  iVar6 = strcmp(word,"untrap with");
  if ((iVar6 == 0) && (otmp->oclass == '\x06' && uVar3 != 0xf5)) {
    return UNSUITABLE_USE;
  }
  iVar6 = strcmp(word,"charge");
  if ((iVar6 == 0) && (bVar4 = is_chargeable(otmp), bVar4 == '\0')) {
    return UNSUITABLE_USE;
  }
  cVar1 = otmp->oclass;
  if ((cVar1 == '\f') &&
     ((iVar6 = strcmp(word,"eat"), iVar6 == 0 &&
      (youmonst.data == mons + 0xd9 || -1 < (int)(youmonst.data)->mflags1)))) {
    return UNSUITABLE_USE;
  }
  bVar4 = putting_on(word);
  if (((cVar1 == '\x03') && (bVar4 != '\0')) &&
     (iVar6 = canwearobj(otmp,&lStack_38,'\0'), iVar6 == 0)) {
    return CURRENTLY_NOT_USABLE;
  }
  return OBJECT_USABLE;
}

Assistant:

static enum obj_use_status object_selection_checks(struct obj *otmp,
						   const char *word)
{
	long dummymask;
	int otyp = otmp->otyp;
	
	/* ugly check: remove inappropriate things */
	if ((taking_off(word) &&
	    !(otmp->owornmask & (W_ARMOR | W_RING | W_AMUL | W_TOOL)))
	|| (putting_on(word) &&
		(otmp->owornmask & (W_ARMOR | W_RING | W_AMUL | W_TOOL))) /* already worn */
	|| (!strcmp(word, "ready") &&
	    (otmp == uwep || (otmp == uswapwep && u.twoweap))))
	    return ALREADY_IN_USE;

	if (taking_off(word) &&
	    ((otmp == uarm && uarmc) || (otmp == uarmu && (uarm || uarmc))))
	    return ARMOR_TAKEOFF_BLOCKED;

	/* Second ugly check; unlike the first it won't trigger an
	 * "else" in "you don't have anything else to ___".
	 */
	else if ((putting_on(word) &&
	    ((otmp->oclass == FOOD_CLASS && otmp->otyp != MEAT_RING) ||
	    (otmp->oclass == TOOL_CLASS &&
		otyp != BLINDFOLD && otyp != TOWEL && otyp != LENSES)))
	    || (!strcmp(word, "wield") &&
		(otmp->oclass == TOOL_CLASS && !is_weptool(otmp)))
	    || (!strcmp(word, "eat") && !is_edible(otmp))
	    || (!strcmp(word, "sacrifice") &&
		(otyp != CORPSE &&
		    otyp != AMULET_OF_YENDOR && otyp != FAKE_AMULET_OF_YENDOR))
	    || (!strcmp(word, "write with") &&
		(otmp->oclass == TOOL_CLASS &&
		    otyp != MAGIC_MARKER && otyp != TOWEL))
	    || (!strcmp(word, "tin") &&
		(otyp != CORPSE || !tinnable(otmp)))
	    || (!strcmp(word, "rub") &&
		((otmp->oclass == TOOL_CLASS &&
		    otyp != OIL_LAMP && otyp != MAGIC_LAMP &&
		    otyp != BRASS_LANTERN) ||
		    (otmp->oclass == GEM_CLASS && !is_graystone(otmp))))
	    || (!strncmp(word, "rub on the stone", 16) &&
		otmp->oclass == GEM_CLASS &&	/* using known touchstone */
		otmp->dknown && objects[otyp].oc_name_known)
	    || (!strcmp(word, "tip") &&
		!Is_container(otmp))
	    || ((!strcmp(word, "use or apply") ||
		    !strcmp(word, "untrap with")) &&
		    /* Picks, axes, pole-weapons, bullwhips */
		((otmp->oclass == WEAPON_CLASS && !is_pick(otmp) &&
		    !is_axe(otmp) && !is_pole(otmp) && otyp != BULLWHIP) ||
		    otmp->oclass == COIN_CLASS ||
		    (otmp->oclass == POTION_CLASS &&
		    /* only applicable potion is oil, and it will only
		    be offered as a choice when already discovered */
		    (otyp != POT_OIL || !otmp->dknown ||
		     !objects[POT_OIL].oc_name_known)) ||
		    (otmp->oclass == FOOD_CLASS &&
		     otyp != CREAM_PIE && otyp != EUCALYPTUS_LEAF) ||
		    (otmp->oclass == GEM_CLASS && !is_graystone(otmp))))
                 || (!strncmp(word, "invoke", 6) &&
		(!otmp->oartifact && !objects[otyp].oc_unique &&
		     otyp != FAKE_AMULET_OF_YENDOR &&
                     otmp->oclass != WAND_CLASS && /* V for breaking wands */
                     ((otmp->oclass == TOOL_CLASS && /* V for rubbing */
                       otyp != OIL_LAMP && otyp != MAGIC_LAMP &&
                       otyp != BRASS_LANTERN) ||
                      (otmp->oclass == GEM_CLASS && !is_graystone(otmp)) ||
                      (otmp->oclass != TOOL_CLASS && otmp->oclass != GEM_CLASS)) &&
		     otyp != CRYSTAL_BALL &&	/* V for applying */
		/* note: presenting the possibility of invoking non-artifact
		    mirrors and/or lamps is a simply a cruel deception... */
		     otyp != MIRROR && otyp != MAGIC_LAMP &&
		    (otyp != OIL_LAMP ||	/* don't list known oil lamp */
		    (otmp->dknown && objects[OIL_LAMP].oc_name_known))))
	    || (!strcmp(word, "untrap with") &&
		(otmp->oclass == TOOL_CLASS && otyp != CAN_OF_GREASE))
	    || (!strcmp(word, "charge") && !is_chargeable(otmp))
	    || (otmp->oclass == COIN_CLASS && !strcmp(word, "eat") &&
		(!metallivorous(youmonst.data) || youmonst.data == &mons[PM_RUST_MONSTER])))
	    return UNSUITABLE_USE;
		
	/* ugly check for unworn armor that can't be worn */
	else if (putting_on(word) && otmp->oclass == ARMOR_CLASS &&
		    !canwearobj(otmp, &dummymask, FALSE))
	    return CURRENTLY_NOT_USABLE;
	
	return OBJECT_USABLE;
}